

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O3

string * Settings::destFolder_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,dest_folder_str_abi_cxx11_,DAT_001278b8 + dest_folder_str_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string destFolder(){ return dest_folder_str; }